

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeEqual<wasm::RefCast*,wasm::HeapType::BasicHeapType>
          (ValidationInfo *this,BasicHeapType left,BasicHeapType right,RefCast *curr,char *text,
          Function *func)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  Function *func_local;
  char *text_local;
  RefCast *curr_local;
  BasicHeapType right_local;
  BasicHeapType left_local;
  ValidationInfo *this_local;
  
  if (left != right) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar1 = (ostream *)std::ostream::operator<<(local_1b0,left);
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,right);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,text);
    std::__cxx11::ostringstream::str();
    fail<wasm::RefCast*,std::__cxx11::string>(this,&local_1e0,curr,func);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return left == right;
}

Assistant:

bool shouldBeEqual(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }